

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
Reserve(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        *this,SizeType newCapacity,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  uint uVar1;
  void *pvVar2;
  
  if ((this->data_).f.flags == 4) {
    uVar1 = (this->data_).s.hashcode;
    if (uVar1 < newCapacity) {
      pvVar2 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                         (allocator,(void *)((ulong)(this->data_).s.str & 0xffffffffffff),
                          (ulong)uVar1 << 4,(ulong)newCapacity << 4);
      (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pvVar2);
      (this->data_).s.hashcode = newCapacity;
    }
    return this;
  }
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                ,0x62a,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::Reserve(SizeType, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsArray()  const { return data_.f.flags == kArrayFlag; }